

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64Disassembler.c
# Opt level: O0

DecodeStatus DecodeUnsignedLdStInstruction(MCInst *Inst,uint32_t insn,uint64_t Addr,void *Decoder)

{
  uint32_t RegNo;
  uint32_t RegNo_00;
  uint32_t uVar1;
  uint uVar2;
  uint offset;
  uint Rn;
  uint Rt;
  void *Decoder_local;
  uint64_t Addr_local;
  uint32_t insn_local;
  MCInst *Inst_local;
  
  RegNo = fieldFromInstruction(insn,0,5);
  RegNo_00 = fieldFromInstruction(insn,5,5);
  uVar1 = fieldFromInstruction(insn,10,0xc);
  uVar2 = MCInst_getOpcode(Inst);
  if (uVar2 == 0x3c8) goto LAB_001a84eb;
  if (uVar2 == 0x3cd) {
LAB_001a8572:
    DecodeFPR8RegisterClass(Inst,RegNo,Addr,Decoder);
    goto LAB_001a8586;
  }
  if (uVar2 == 0x3d3) {
LAB_001a8530:
    DecodeFPR64RegisterClass(Inst,RegNo,Addr,Decoder);
    goto LAB_001a8586;
  }
  if (uVar2 == 0x3d8) goto LAB_001a84eb;
  if (uVar2 == 0x3dd) {
LAB_001a855c:
    DecodeFPR16RegisterClass(Inst,RegNo,Addr,Decoder);
    goto LAB_001a8586;
  }
  if (uVar2 == 0x3e3) {
LAB_001a851a:
    DecodeFPR128RegisterClass(Inst,RegNo,Addr,Decoder);
    goto LAB_001a8586;
  }
  if (uVar2 != 1000) {
    if (uVar2 == 0x3ed) {
LAB_001a8504:
      DecodeGPR64RegisterClass(Inst,RegNo,Addr,Decoder);
      goto LAB_001a8586;
    }
    if (uVar2 != 0x3f2) {
      if ((uVar2 == 0x3f7) || (uVar2 == 0x3fd)) goto LAB_001a8504;
      if (uVar2 == 0x403) {
LAB_001a8546:
        DecodeFPR32RegisterClass(Inst,RegNo,Addr,Decoder);
        goto LAB_001a8586;
      }
      if (uVar2 != 0x409) {
        if (uVar2 == 0x40f) goto LAB_001a8504;
        if (uVar2 == 0x49a) {
          MCOperand_CreateImm0(Inst,(ulong)RegNo);
          goto LAB_001a8586;
        }
        if (uVar2 != 0x759) {
          if (uVar2 == 0x75e) goto LAB_001a8572;
          if (uVar2 == 0x763) goto LAB_001a8530;
          if (uVar2 != 0x768) {
            if (uVar2 == 0x76d) goto LAB_001a855c;
            if (uVar2 == 0x772) goto LAB_001a851a;
            if (uVar2 == 0x777) goto LAB_001a8546;
            if (uVar2 != 0x77c) {
              if (uVar2 != 0x781) {
                return MCDisassembler_Fail;
              }
              goto LAB_001a8504;
            }
          }
        }
      }
    }
  }
LAB_001a84eb:
  DecodeGPR32RegisterClass(Inst,RegNo,Addr,Decoder);
LAB_001a8586:
  DecodeGPR64spRegisterClass(Inst,RegNo_00,Addr,Decoder);
  MCOperand_CreateImm0(Inst,(ulong)uVar1);
  return MCDisassembler_Success;
}

Assistant:

static DecodeStatus DecodeUnsignedLdStInstruction(MCInst *Inst,
		uint32_t insn, uint64_t Addr,
		void *Decoder)
{
	unsigned Rt = fieldFromInstruction(insn, 0, 5);
	unsigned Rn = fieldFromInstruction(insn, 5, 5);
	unsigned offset = fieldFromInstruction(insn, 10, 12);

	switch (MCInst_getOpcode(Inst)) {
		default:
			return Fail;
		case AArch64_PRFMui:
			// Rt is an immediate in prefetch.
			MCOperand_CreateImm0(Inst, Rt);
			break;
		case AArch64_STRBBui:
		case AArch64_LDRBBui:
		case AArch64_LDRSBWui:
		case AArch64_STRHHui:
		case AArch64_LDRHHui:
		case AArch64_LDRSHWui:
		case AArch64_STRWui:
		case AArch64_LDRWui:
			DecodeGPR32RegisterClass(Inst, Rt, Addr, Decoder);
			break;
		case AArch64_LDRSBXui:
		case AArch64_LDRSHXui:
		case AArch64_LDRSWui:
		case AArch64_STRXui:
		case AArch64_LDRXui:
			DecodeGPR64RegisterClass(Inst, Rt, Addr, Decoder);
			break;
		case AArch64_LDRQui:
		case AArch64_STRQui:
			DecodeFPR128RegisterClass(Inst, Rt, Addr, Decoder);
			break;
		case AArch64_LDRDui:
		case AArch64_STRDui:
			DecodeFPR64RegisterClass(Inst, Rt, Addr, Decoder);
			break;
		case AArch64_LDRSui:
		case AArch64_STRSui:
			DecodeFPR32RegisterClass(Inst, Rt, Addr, Decoder);
			break;
		case AArch64_LDRHui:
		case AArch64_STRHui:
			DecodeFPR16RegisterClass(Inst, Rt, Addr, Decoder);
			break;
		case AArch64_LDRBui:
		case AArch64_STRBui:
			DecodeFPR8RegisterClass(Inst, Rt, Addr, Decoder);
			break;
	}

	DecodeGPR64spRegisterClass(Inst, Rn, Addr, Decoder);
	//if (!Dis->tryAddingSymbolicOperand(Inst, offset, Addr, Fail, 0, 4))
	MCOperand_CreateImm0(Inst, offset);

	return Success;
}